

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_delete_to_end_of_row(caption_frame_t *frame)

{
  int iVar1;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  caption_frame_t *in_stack_00000008;
  int c;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x1e40) != 0) {
    for (iVar1 = (int)*(char *)(in_RDI + 0x3a); iVar1 < 0x20; iVar1 = iVar1 + 1) {
      caption_frame_write_char
                (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                 (eia608_style_t)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (char *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    }
  }
  return LIBCAPTION_READY;
}

Assistant:

libcaption_stauts_t caption_frame_delete_to_end_of_row(caption_frame_t* frame)
{
    int c;
    if (frame->write) {
        for (c = frame->state.col; c < SCREEN_COLS; ++c) {
            caption_frame_write_char(frame, frame->state.row, c, eia608_style_white, 0, EIA608_CHAR_NULL);
        }
    }

    // TODO test this and replace loop
    //  uint8_t* dst = (uint8_t*)frame_buffer_cell(frame->write, frame->state.row, frame->state.col);
    //  memset(dst,0,sizeof(caption_frame_cell_t) * (SCREEN_COLS - frame->state.col - 1))

    return LIBCAPTION_READY;
}